

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::BaseLineTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BaseLineTestInstance *this)

{
  deUint32 width;
  bool bVar1;
  int iVar2;
  TestContext *pTVar3;
  TestLog *pTVar4;
  TextureFormat *format;
  int *piVar5;
  MessageBuilder *pMVar6;
  float extraout_XMM0_Da;
  allocator<char> local_339;
  string local_338;
  undefined4 local_318;
  allocator<char> local_311;
  string local_310;
  MessageBuilder local_2f0;
  undefined1 local_170 [8];
  IVec4 colorBits;
  LineSceneSpec scene;
  RasterizationArguments args;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  float lineWidth;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  BaseLineTestInstance *this_local;
  
  local_9c = this->m_iteration + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar3 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&stack0xffffffffffffff28,pTVar4,(string *)local_38,
             (string *)local_38);
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])();
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  resultImage.m_pixels.m_cap._4_4_ = extraout_XMM0_Da;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,width,width);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &lines.
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::vector
            ((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              *)&args.greenBits);
  if (this->m_maxLineWidth < resultImage.m_pixels.m_cap._4_4_) {
    pTVar3 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_2f0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_2f0,(char (*) [12])"Line width ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(float *)((long)&resultImage.m_pixels.m_cap + 4));
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [36])" not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2f0);
  }
  else {
    (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[7])
              (this,(ulong)(uint)this->m_iteration,
               &lines.
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&args.greenBits);
    BaseRenderingTestInstance::drawPrimitives
              (&this->super_BaseRenderingTestInstance,
               (Surface *)
               &drawBuffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &lines.
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_primitiveTopology);
    tcu::LineSceneSpec::LineSceneSpec((LineSceneSpec *)(colorBits.m_data + 2));
    format = BaseRenderingTestInstance::getTextureFormat(&this->super_BaseRenderingTestInstance);
    tcu::getTextureFormatBitDepth((tcu *)local_170,format);
    scene._28_4_ = ZEXT14((this->super_BaseRenderingTestInstance).m_multisampling != 0);
    piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_170,0);
    args.numSamples = *piVar5;
    piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_170,1);
    args.subpixelBits = *piVar5;
    piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_170,2);
    args.redBits = *piVar5;
    std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::swap
              ((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                *)(colorBits.m_data + 2),
               (vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                *)&args.greenBits);
    scene.lines.
    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = resultImage.m_pixels.m_cap._4_4_;
    pTVar3 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    bVar1 = tcu::verifyClippedTriangulatedLineGroupRasterization
                      ((Surface *)
                       &drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (LineSceneSpec *)(colorBits.m_data + 2),
                       (RasterizationArguments *)&scene.field_0x1c,pTVar4);
    if (!bVar1) {
      this->m_allIterationsPassed = false;
    }
    tcu::LineSceneSpec::~LineSceneSpec((LineSceneSpec *)(colorBits.m_data + 2));
  }
  iVar2 = this->m_iteration + 1;
  this->m_iteration = iVar2;
  if (iVar2 == this->m_iterationCount) {
    if ((this->m_allIterationsPassed & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,"Incorrect rasterization",&local_339);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator(&local_339);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"Pass",&local_311);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  local_318 = 1;
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~vector((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> *)
          &args.greenBits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &lines.
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BaseLineTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// gen data
		generateLines(m_iteration, drawBuffer, lines);

		// draw image
		drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;


			tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

			args.numSamples		= m_multisampling ? 1 : 0;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= colorBits[0];
			args.greenBits		= colorBits[1];
			args.blueBits		= colorBits[2];

			scene.lines.swap(lines);
			scene.lineWidth = lineWidth;

			if (!verifyClippedTriangulatedLineGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog()))
				m_allIterationsPassed = false;
		}
	}
	else
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}